

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O0

_tExecReaction __thiscall yactfr::internal::Vm::_execReadFlBitArrayLeRev(Vm *this,Instr *instr)

{
  Instr *instr_local;
  Vm *this_local;
  
  _execReadFlBitArray<yactfr::internal::(anonymous_namespace)::readFlUIntLeFuncs,_true>(this,instr);
  return FetchNextInstrAndStop;
}

Assistant:

Vm::_tExecReaction Vm::_execReadFlBitArrayLeRev(const Instr& instr)
{
    this->_execReadFlBitArray<readFlUIntLeFuncs, true>(instr);
    return _tExecReaction::FetchNextInstrAndStop;
}